

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_quantization.cc
# Opt level: O0

bool __thiscall
sptk::VectorQuantization::Run
          (VectorQuantization *this,vector<double,_std::allocator<double>_> *input_vector,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *codebook_vectors,int *codebook_index)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  int *in_RCX;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  long in_RDI;
  double *in_stack_00000010;
  vector<double,_std::allocator<double>_> *in_stack_00000018;
  double distance;
  DistanceCalculation *in_stack_00000028;
  int i;
  double min_distance;
  int index;
  int codebook_size;
  double local_48;
  int local_3c;
  double local_38;
  int local_30;
  
  sVar2 = std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::size(in_RDX);
  if (((((*(byte *)(in_RDI + 0x28) & 1) != 0) &&
       (sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RSI),
       sVar3 == (long)(*(int *)(in_RDI + 8) + 1))) && ((int)sVar2 != 0)) && (in_RCX != (int *)0x0))
  {
    local_30 = 0;
    local_38 = 1.79769313486232e+308;
    local_3c = 0;
    while( true ) {
      if ((int)sVar2 <= local_3c) {
        *in_RCX = local_30;
        return true;
      }
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[](in_RDX,(long)local_3c);
      bVar1 = DistanceCalculation::Run
                        (in_stack_00000028,(vector<double,_std::allocator<double>_> *)distance,
                         in_stack_00000018,in_stack_00000010);
      if (!bVar1) break;
      if (local_48 < local_38) {
        local_30 = local_3c;
        local_38 = local_48;
      }
      local_3c = local_3c + 1;
    }
    return false;
  }
  return false;
}

Assistant:

bool VectorQuantization::Run(
    const std::vector<double>& input_vector,
    const std::vector<std::vector<double> >& codebook_vectors,
    int* codebook_index) const {
  // Check inputs.
  const int codebook_size(static_cast<int>(codebook_vectors.size()));
  if (!is_valid_ ||
      input_vector.size() != static_cast<std::size_t>(num_order_ + 1) ||
      0 == codebook_size || NULL == codebook_index) {
    return false;
  }

  int index(0);
  double min_distance(sptk::kMax);

  for (int i(0); i < codebook_size; ++i) {
    double distance;
    if (!distance_calculation_.Run(input_vector, codebook_vectors[i],
                                   &distance)) {
      return false;
    }
    if (distance < min_distance) {
      index = i;
      min_distance = distance;
    }
  }

  *codebook_index = index;

  return true;
}